

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O3

int kftp_connect_file(knetFile *fp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  longlong file_size;
  char tmp [32];
  char local_3a [10];
  char *pcVar5;
  
  if (fp->fd != -1) {
    close(fp->fd);
    if (fp->no_reconnect != 0) {
      kftp_get_response(fp);
    }
  }
  kftp_send_cmd(fp,"PASV\r\n",1);
  pcVar5 = fp->response;
  do {
    pcVar4 = pcVar5 + 1;
    cVar1 = *pcVar5;
    if (cVar1 == '\0') goto LAB_00112efb;
    pcVar5 = pcVar4;
  } while (cVar1 != '(');
  __isoc99_sscanf(pcVar4,"%d,%d,%d,%d,%d,%d",tmp,tmp + 4,tmp + 8,tmp + 0xc,tmp + 0x10,tmp + 0x14);
  *(undefined8 *)fp->pasv_ip = tmp._0_8_;
  *(undefined8 *)(fp->pasv_ip + 2) = tmp._8_8_;
  fp->pasv_port = (tmp._16_4_ & 0xff) * 0x100 + tmp._20_4_;
LAB_00112efb:
  kftp_send_cmd(fp,fp->size_cmd,1);
  iVar2 = __isoc99_sscanf(fp->response,"%*d %lld",&file_size);
  iVar3 = -1;
  if (iVar2 == 1) {
    fp->file_size = file_size;
    if (-1 < fp->offset) {
      sprintf(tmp,"REST %lld\r\n");
      kftp_send_cmd(fp,tmp,1);
    }
    kftp_send_cmd(fp,fp->retr,0);
    if (fp->pasv_port == 0) {
      kftp_connect_file_cold_1();
    }
    else {
      sprintf(tmp,"%d.%d.%d.%d",(ulong)(uint)fp->pasv_ip[0],(ulong)(uint)fp->pasv_ip[1],
              (ulong)(uint)fp->pasv_ip[2],(ulong)(uint)fp->pasv_ip[3]);
      sprintf(local_3a,"%d",(ulong)(uint)fp->pasv_port);
      iVar2 = socket_connect(tmp,local_3a);
      fp->fd = iVar2;
    }
    iVar2 = kftp_get_response(fp);
    if (iVar2 == 0x96) {
      fp->is_ready = 1;
      iVar3 = 0;
    }
    else {
      kftp_connect_file_cold_2();
    }
  }
  return iVar3;
}

Assistant:

int kftp_connect_file(knetFile *fp)
{
	int ret;
	long long file_size;
	if (fp->fd != -1) {
		netclose(fp->fd);
		if (fp->no_reconnect) kftp_get_response(fp);
	}
	kftp_pasv_prep(fp);
    kftp_send_cmd(fp, fp->size_cmd, 1);
#ifndef _WIN32
    // If the file does not exist, the response will be "550 Could not get file
    // size". Be silent on failure, hts_idx_load can be trying the existence of .csi or .tbi.
    if ( sscanf(fp->response,"%*d %lld", &file_size) != 1 ) return -1;
#else
	const char *p = fp->response;
	while (*p != ' ') ++p;
	while (*p < '0' || *p > '9') ++p;
	file_size = strtoint64(p);
#endif
	fp->file_size = file_size;
	if (fp->offset>=0) {
		char tmp[32];
#ifndef _WIN32
		sprintf(tmp, "REST %lld\r\n", (long long)fp->offset);
#else
		strcpy(tmp, "REST ");
		int64tostr(tmp + 5, fp->offset);
		strcat(tmp, "\r\n");
#endif
		kftp_send_cmd(fp, tmp, 1);
	}
	kftp_send_cmd(fp, fp->retr, 0);
	kftp_pasv_connect(fp);
	ret = kftp_get_response(fp);
	if (ret != 150) {
		fprintf(stderr, "[kftp_connect_file] %s\n", fp->response);
		netclose(fp->fd);
		fp->fd = -1;
		return -1;
	}
	fp->is_ready = 1;
	return 0;
}